

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O0

void anon_unknown.dwarf_1677::parseSystemAlertComponent
               (ndicapi *api,char *data,unsigned_short itemOption,uint itemCount)

{
  ushort local_2a;
  unsigned_short *puStack_28;
  unsigned_short i;
  char *dataIndex;
  uint itemCount_local;
  unsigned_short itemOption_local;
  char *data_local;
  ndicapi *api_local;
  
  api->Bx2SystemAlertsCount = itemCount;
  puStack_28 = (unsigned_short *)data;
  for (local_2a = 0; local_2a < itemCount; local_2a = local_2a + 1) {
    api->Bx2SystemAlerts[local_2a][0] = *puStack_28;
    api->Bx2SystemAlerts[local_2a][1] = puStack_28[1];
    puStack_28 = puStack_28 + 2;
  }
  return;
}

Assistant:

void parseSystemAlertComponent(ndicapi* api, const char* data, unsigned short itemOption, unsigned int itemCount)
  {
    const char* dataIndex = data;
    api->Bx2SystemAlertsCount = itemCount;
    for (unsigned short i = 0; i < itemCount; ++i)
    {
      api->Bx2SystemAlerts[i][0] = (unsigned char)dataIndex[1] << 8 | (unsigned char)dataIndex[0];
      dataIndex += 2;

      api->Bx2SystemAlerts[i][1] = (unsigned char)dataIndex[1] << 8 | (unsigned char)dataIndex[0];
      dataIndex += 2;
    }
  }